

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::ShaderBitfieldOperationCase::iterate(ShaderBitfieldOperationCase *this)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  undefined8 uVar6;
  TestError *pTVar7;
  char *description;
  allocator<char> local_de;
  allocator<char> local_dd;
  GLuint data;
  GLint compileSuccess;
  GLint linkSuccess;
  char *strings [1];
  _Rb_tree_node_base local_90;
  size_t local_70;
  char *local_68 [4];
  string csString;
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x6c8))(1,&data);
  (**(code **)(lVar4 + 0x40))(0x90d2,data);
  (**(code **)(lVar4 + 0x150))(0x90d2,0xd0,&this->m_data,0x88e4);
  (**(code **)(lVar4 + 0x48))(0x90d2,0,data);
  uVar2 = (**(code **)(lVar4 + 0x3f0))(0x91b9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,
             "${VERSION_DECL}\n\nlayout(local_size_x = 1) in;\n\nlayout(binding = 0, std430) buffer Data {\n    uvec4 inUvec4;\n    ivec4 inIvec4;\n    vec4 inVec4;\n\n    uvec4 in2Uvec4;\n    ivec4 in2Ivec4;\n    vec4 in2Vec4;\n\n    int offset;\n    int bits;\n\n    uvec4 outUvec4;\n    ivec4 outIvec4;\n    vec4 outVec4;\n\n    uvec4 out2Uvec4;\n    ivec4 out2Ivec4;\n    vec4 out2Vec4;\n};\n\nvoid main()\n{\n    ${TEST_STATEMENT};\n}\n"
             ,&local_de);
  local_90._M_left = &local_90;
  local_90._M_color = _S_red;
  local_90._M_parent = (_Base_ptr)0x0;
  local_70 = 0;
  local_90._M_right = local_90._M_left;
  glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compileSuccess,"VERSION_DECL",(allocator<char> *)&linkSuccess);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)strings,(key_type *)&compileSuccess);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&compileSuccess);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compileSuccess,"TEST_STATEMENT",(allocator<char> *)&linkSuccess);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)strings,(key_type *)&compileSuccess);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&compileSuccess);
  std::__cxx11::string::string<std::allocator<char>>((string *)&linkSuccess,local_68[0],&local_dd);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&compileSuccess,(string *)&linkSuccess);
  tcu::StringTemplate::specialize
            (&csString,(StringTemplate *)&compileSuccess,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)strings);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&compileSuccess);
  std::__cxx11::string::~string((string *)&linkSuccess);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)strings);
  std::__cxx11::string::~string((string *)local_68);
  strings[0] = csString._M_dataplus._M_p;
  (**(code **)(lVar4 + 0x12b8))(uVar2,1,strings,0);
  (**(code **)(lVar4 + 0x248))(uVar2);
  compileSuccess = 0;
  (**(code **)(lVar4 + 0xa70))(uVar2,0x8b81);
  if (compileSuccess == 0) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cShaderBitfieldOperationTests.cpp"
               ,0xc9);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar3 = (**(code **)(lVar4 + 0x3c8))();
  (**(code **)(lVar4 + 0x10))(uVar3,uVar2);
  (**(code **)(lVar4 + 0xce8))(uVar3);
  linkSuccess = 0;
  (**(code **)(lVar4 + 0x9d8))(uVar3,0x8b82);
  if (linkSuccess != 0) {
    (**(code **)(lVar4 + 0x1680))(uVar3);
    (**(code **)(lVar4 + 0x528))(1,1,1);
    uVar6 = (**(code **)(lVar4 + 0xd00))(0x90d2,0,0xd0,1);
    iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,uVar6);
    (**(code **)(lVar4 + 0x1670))(0x90d2);
    (**(code **)(lVar4 + 0x1680))(0);
    (**(code **)(lVar4 + 0x448))(uVar3);
    (**(code **)(lVar4 + 0x470))(uVar2);
    (**(code **)(lVar4 + 0x438))(1,&data);
    description = "Fail";
    if ((byte)iVar1 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar1 ^ 1),description);
    std::__cxx11::string::~string((string *)&csString);
    return STOP;
  }
  (**(code **)(lVar4 + 0x470))(uVar2);
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Link failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cShaderBitfieldOperationTests.cpp"
             ,0xd4);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ShaderBitfieldOperationCase::IterateResult ShaderBitfieldOperationCase::iterate()
{
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	GLuint data;
	gl.genBuffers(1, &data);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, data);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(Data), &m_data, GL_STATIC_DRAW);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, data);

	char const* css = "${VERSION_DECL}\n"
					  "\n"
					  "layout(local_size_x = 1) in;\n"
					  "\n"
					  "layout(binding = 0, std430) buffer Data {\n"
					  "    uvec4 inUvec4;\n"
					  "    ivec4 inIvec4;\n"
					  "    vec4 inVec4;\n"
					  "\n"
					  "    uvec4 in2Uvec4;\n"
					  "    ivec4 in2Ivec4;\n"
					  "    vec4 in2Vec4;\n"
					  "\n"
					  "    int offset;\n"
					  "    int bits;\n"
					  "\n"
					  "    uvec4 outUvec4;\n"
					  "    ivec4 outIvec4;\n"
					  "    vec4 outVec4;\n"
					  "\n"
					  "    uvec4 out2Uvec4;\n"
					  "    ivec4 out2Ivec4;\n"
					  "    vec4 out2Vec4;\n"
					  "};\n"
					  "\n"
					  "void main()\n"
					  "{\n"
					  "    ${TEST_STATEMENT};\n"
					  "}\n";

	GLuint		cs		   = gl.createShader(GL_COMPUTE_SHADER);
	std::string csString   = specializeVersion(css, m_glslVersion, m_testStatement.c_str());
	char const* strings[1] = { csString.c_str() };
	gl.shaderSource(cs, 1, strings, 0);
	gl.compileShader(cs);
	GLint compileSuccess = 0;
	gl.getShaderiv(cs, GL_COMPILE_STATUS, &compileSuccess);
	if (!compileSuccess)
	{
		TCU_FAIL("Compile failed");
	}

	GLuint pgm = gl.createProgram();
	gl.attachShader(pgm, cs);
	gl.linkProgram(pgm);
	GLint linkSuccess = 0;
	gl.getProgramiv(pgm, GL_LINK_STATUS, &linkSuccess);
	if (!linkSuccess)
	{
		gl.deleteShader(cs);
		TCU_FAIL("Link failed");
	}

	gl.useProgram(pgm);

	gl.dispatchCompute(1, 1, 1);

	Data const* results = (Data const*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Data), GL_MAP_READ_BIT);
	isOk				= test(results);
	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);

	gl.useProgram(0);
	gl.deleteProgram(pgm);
	gl.deleteShader(cs);

	gl.deleteBuffers(1, &data);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}